

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqliteBuiltin_db_get_schema(jx9_context *pCtx,int argc,jx9_value **argv)

{
  jx9_user_func *pjVar1;
  jx9_value *pObj;
  unqlite_col *puVar2;
  char *zMessage;
  int iFlag;
  jx9_vm *pVm;
  int nByte;
  SyString sName;
  uint local_24;
  SyString local_20;
  
  if (argc < 1) {
    pjVar1 = pCtx->pFunc;
    pVm = pCtx->pVm;
    zMessage = "Missing collection name and/or db scheme";
  }
  else {
    local_20.zString = jx9_value_to_string(*argv,(int *)&local_24);
    if (0 < (int)local_24) {
      local_20.nByte = local_24;
      puVar2 = unqliteCollectionFetch((unqlite_vm *)pCtx->pFunc->pUserData,&local_20,iFlag);
      if (puVar2 != (unqlite_col *)0x0) {
        jx9MemObjStore(&puVar2->sSchema,pCtx->pRet);
        return 0;
      }
      jx9_context_throw_error_format(pCtx,2,"No such collection \'%z\'",&local_20);
      jx9MemObjRelease(pCtx->pRet);
      return 0;
    }
    pjVar1 = pCtx->pFunc;
    pVm = pCtx->pVm;
    zMessage = "Invalid collection name";
  }
  jx9VmThrowError(pVm,&pjVar1->sName,1,zMessage);
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = 0.0;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int unqliteBuiltin_db_get_schema(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_col *pCol;
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	int nByte;
	/* Extract collection name */
	if( argc < 1 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name and/or db scheme");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Fetch the collection */
	pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
	if( pCol ){
		/* Return the collection schema */
		jx9_result_value(pCtx,&pCol->sSchema);
	}else{
		jx9_context_throw_error_format(pCtx,JX9_CTX_WARNING,
			"No such collection '%z'",
			&sName
			);
		jx9_result_null(pCtx);
	}
	return JX9_OK;
}